

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

bool __thiscall QDockAreaLayoutInfo::hasGapItem(QDockAreaLayoutInfo *this,QList<int> *path)

{
  ulong uVar1;
  
  if ((((path->d).size != 0) && (uVar1 = (ulong)*(path->d).ptr, -1 < (long)uVar1)) &&
     (uVar1 < (ulong)(this->item_list).d.size)) {
    return (bool)((byte)(this->item_list).d.ptr[uVar1].flags & 1);
  }
  return false;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }